

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O3

Node256Leaf * duckdb::Node256Leaf::GrowNode15Leaf(ART *art,Node *node256_leaf,Node *node15_leaf)

{
  byte bVar1;
  byte bVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  type paVar5;
  iterator iVar6;
  pointer this;
  data_ptr_t pdVar7;
  Node256Leaf *pNVar8;
  ulong uVar9;
  long lVar10;
  ulong local_38;
  
  uVar9 = (node15_leaf->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar5->_M_elems[7].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar9 & 0xffffffff;
  iVar6 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var3._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar10 = (ulong)((uint)(uVar9 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pNVar8 = New(art,node256_leaf);
  (node256_leaf->super_IndexPointer).data =
       (node15_leaf->super_IndexPointer).data & 0x8000000000000000 |
       (node256_leaf->super_IndexPointer).data & 0x7fffffffffffffff;
  bVar1 = pdVar7[iVar4 + lVar10];
  pNVar8->count = (ushort)bVar1;
  if (bVar1 != 0) {
    uVar9 = 0;
    do {
      bVar2 = (pdVar7 + iVar4 + lVar10)[uVar9 + 1];
      pNVar8->mask[bVar2 >> 6] = pNVar8->mask[bVar2 >> 6] | 1L << (bVar2 & 0x3f);
      uVar9 = uVar9 + 1;
    } while (bVar1 != uVar9);
  }
  pdVar7[iVar4 + lVar10] = '\0';
  Node::Free(art,node15_leaf);
  return pNVar8;
}

Assistant:

Node256Leaf &Node256Leaf::GrowNode15Leaf(ART &art, Node &node256_leaf, Node &node15_leaf) {
	auto &n15 = Node::Ref<Node15Leaf>(art, node15_leaf, NType::NODE_15_LEAF);
	auto &n256 = New(art, node256_leaf);
	node256_leaf.SetGateStatus(node15_leaf.GetGateStatus());

	n256.count = n15.count;
	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	for (uint8_t i = 0; i < n15.count; i++) {
		mask.SetValid(n15.key[i]);
	}

	n15.count = 0;
	Node::Free(art, node15_leaf);
	return n256;
}